

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_util.c
# Opt level: O0

attr_list CMint_attr_copy_list(CManager cm,attr_list l,char *file,int line)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  CManager unaff_retaddr;
  timespec ts;
  attr_list ret;
  timespec local_38;
  attr_list local_28;
  uint local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = (attr_list)attr_copy_list(in_RSI);
  iVar1 = CMtrace_val[8];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(unaff_retaddr,(CMTraceType)((ulong)in_RDI >> 0x20));
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = *(FILE **)(in_RDI + 0x120);
      _Var2 = getpid();
      pVar3 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_38);
      fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
    }
    fprintf(*(FILE **)(in_RDI + 0x120),"Copy attr list %p at %s:%d, new list %p\n",local_10,local_18
            ,(ulong)local_1c,local_28);
  }
  fflush(*(FILE **)(in_RDI + 0x120));
  return local_28;
}

Assistant:

extern attr_list 
CMint_attr_copy_list(CManager cm, attr_list l, char *file, int line)
{
    attr_list ret = attr_copy_list(l);
    (void)cm;
    CMtrace_out(cm, CMAttrVerbose, "Copy attr list %p at %s:%d, new list %p\n", 
		l, file, line, ret);
    return ret;
}